

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlconfig.c
# Opt level: O3

int configure_urlbase(IXML_Document *doc,sockaddr *serverAddr,char *alias,time_t last_modified,
                     char *docURL)

{
  char cVar1;
  ushort uVar2;
  time_t last_modified_00;
  uint uVar3;
  int iVar4;
  IXML_NodeList *nList;
  IXML_Node *pIVar5;
  size_t sVar6;
  IXML_Element *element;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  char *__s_00;
  long lVar9;
  ulong __maxlen;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  membuffer url_str;
  char buf_ntop [46];
  char ipaddr_port [180];
  membuffer local_208;
  time_t local_1e8;
  char *local_1e0;
  membuffer local_1d8;
  uri_type local_1b8;
  char local_e8 [184];
  
  uVar2 = serverAddr->sa_family;
  uVar3 = (uint)uVar2;
  local_1e0 = docURL;
  if (uVar2 == 2) {
    pcVar12 = "%s:%d";
    lVar9 = 4;
LAB_001169b2:
    inet_ntop(uVar3,serverAddr->sa_data + lVar9 + -2,(char *)&local_1b8,0x2e);
    uVar3 = snprintf(local_e8,0xb4,pcVar12,&local_1b8,
                     (ulong)(ushort)(*(ushort *)serverAddr->sa_data << 8 |
                                    *(ushort *)serverAddr->sa_data >> 8));
    if (uVar3 < 0xb4) goto LAB_00116a01;
    iVar10 = -0x6a;
    pcVar12 = (char *)0x0;
LAB_00116cb6:
    __s = (char *)0x0;
  }
  else {
    if (uVar2 == 10) {
      pcVar12 = "[%s]:%d";
      uVar3 = 10;
      lVar9 = 8;
      goto LAB_001169b2;
    }
LAB_00116a01:
    local_1e8 = last_modified;
    membuffer_init(&local_208);
    membuffer_init(&local_1d8);
    nList = ixmlDocument_getElementsByTagName(doc,"URLBase");
    if (nList == (IXML_NodeList *)0x0) {
      element = ixmlDocument_createElement(doc,"URLBase");
      iVar10 = -0x68;
      if (element == (IXML_Element *)0x0) goto LAB_00116c8b;
      iVar4 = membuffer_append_str(&local_208,"http://");
      if ((((iVar4 == 0) && (iVar4 = membuffer_append_str(&local_208,local_e8), iVar4 == 0)) &&
          (iVar4 = membuffer_append_str(&local_208,"/"), iVar4 == 0)) &&
         (iVar4 = membuffer_append_str(&local_1d8,"/"), iVar4 == 0)) {
        pIVar5 = ixmlNode_getFirstChild(&doc->n);
        iVar10 = -0x6b;
        if ((pIVar5 != (IXML_Node *)0x0) &&
           (iVar4 = ixmlNode_appendChild(pIVar5,&element->n), iVar4 == 0)) {
          pIVar5 = ixmlDocument_createTextNode(doc,local_208.buf);
          if (pIVar5 == (IXML_Node *)0x0) {
            pcVar12 = (char *)0x0;
            goto LAB_00116eba;
          }
          iVar4 = ixmlNode_appendChild(&element->n,pIVar5);
          iVar10 = -0x38f;
          if (iVar4 == 0) goto LAB_00116c73;
        }
      }
LAB_00116c8d:
      ixmlElement_free(element);
      pcVar12 = (char *)0x0;
    }
    else {
      pIVar5 = ixmlNodeList_item(nList,0);
      if (pIVar5 == (IXML_Node *)0x0) {
        __assert_fail("urlbase_node != NULL",".upnp/src/urlconfig/urlconfig.c",0x11e,
                      "int config_description_doc(IXML_Document *, const char *, char **)");
      }
      pIVar5 = ixmlNode_getFirstChild(pIVar5);
      if (pIVar5 == (IXML_Node *)0x0) {
        iVar10 = -0x6b;
LAB_00116c8b:
        element = (IXML_Element *)0x0;
        goto LAB_00116c8d;
      }
      pcVar12 = ixmlNode_getNodeValue(pIVar5);
      iVar10 = -0x6c;
      if (pcVar12 == (char *)0x0) goto LAB_00116c8b;
      sVar6 = strlen(pcVar12);
      iVar4 = parse_uri(pcVar12,sVar6,&local_1b8);
      element = (IXML_Element *)0x0;
      if ((iVar4 < 0) || (local_1b8.type != ABSOLUTE)) goto LAB_00116c8d;
      iVar4 = membuffer_assign(&local_208,local_1b8.scheme.buff,local_1b8.scheme.size);
      iVar10 = -0x68;
      if ((((iVar4 != 0) ||
           ((iVar4 = membuffer_append_str(&local_208,"://"), iVar4 != 0 ||
            (iVar4 = membuffer_append_str(&local_208,local_e8), iVar4 != 0)))) ||
          (((local_1b8.pathquery.size == 0 || (*local_1b8.pathquery.buff != '/')) &&
           ((iVar4 = membuffer_append_str(&local_208,"/"), iVar4 != 0 ||
            (iVar4 = membuffer_append_str(&local_1d8,"/"), iVar4 != 0)))))) ||
         (((iVar4 = membuffer_append(&local_208,local_1b8.pathquery.buff,local_1b8.pathquery.size),
           iVar4 != 0 ||
           (iVar4 = membuffer_append(&local_1d8,local_1b8.pathquery.buff,local_1b8.pathquery.size),
           iVar4 != 0)) ||
          (((local_208.buf[local_208.length - 1] != '/' &&
            (iVar4 = membuffer_append(&local_208,"/",1), iVar4 != 0)) ||
           (iVar4 = ixmlNode_setNodeValue(pIVar5,local_208.buf), iVar4 != 0)))))) goto LAB_00116c8b;
LAB_00116c73:
      pcVar12 = membuffer_detach(&local_1d8);
LAB_00116eba:
      iVar10 = 0;
    }
    ixmlNodeList_free(nList);
    membuffer_destroy(&local_1d8);
    membuffer_destroy(&local_208);
    if (iVar10 != 0) goto LAB_00116cb6;
    if (pcVar12 == (char *)0x0) {
      __assert_fail("rootPath",".upnp/src/urlconfig/urlconfig.c",0x8a,
                    "int calc_alias(const char *, const char *, char **)");
    }
    if (alias == (char *)0x0) {
      __assert_fail("alias",".upnp/src/urlconfig/urlconfig.c",0x8b,
                    "int calc_alias(const char *, const char *, char **)");
    }
    sVar6 = strlen(pcVar12);
    if (sVar6 == 0) {
      pcVar11 = "/";
    }
    else {
      pcVar11 = "/";
      if (pcVar12[sVar6 - 1] == '/') {
        pcVar11 = "";
      }
    }
    cVar1 = *alias;
    sVar7 = strlen(pcVar11);
    sVar8 = strlen(alias + (cVar1 == '/'));
    sVar6 = sVar8 + sVar6 + sVar7 + 1;
    __s = (char *)calloc(1,sVar6);
    if (__s == (char *)0x0) {
      iVar10 = -0x68;
      goto LAB_00116cb6;
    }
    snprintf(__s,sVar6,"%s%s%s",pcVar12,pcVar11,alias + (cVar1 == '/'));
    sVar6 = strlen(local_e8);
    if (sVar6 == 0) {
      __assert_fail("ipPortStr != NULL && strlen(ipPortStr) > 0",".upnp/src/urlconfig/urlconfig.c",
                    0xc0,"int calc_descURL(const char *, const char *, char *)");
    }
    sVar7 = strlen(__s);
    pcVar11 = local_1e0;
    last_modified_00 = local_1e8;
    if (sVar7 == 0) {
      __assert_fail("alias != NULL && strlen(alias) > 0",".upnp/src/urlconfig/urlconfig.c",0xc1,
                    "int calc_descURL(const char *, const char *, char *)");
    }
    __maxlen = sVar6 + sVar7 + 8;
    iVar10 = 0;
    if (__maxlen < 0xb5) {
      snprintf(local_1e0,__maxlen,"%s%s%s","http://",local_e8,__s);
      UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0xc9,"desc url: %s\n",pcVar11);
      __s_00 = ixmlPrintDocument(doc);
      if (__s_00 != (char *)0x0) {
        UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a0,"desc url: %s\n",pcVar11);
        UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a1,"doc = %s\n",__s_00);
        sVar6 = strlen(__s_00);
        iVar10 = web_server_set_alias(__s,__s_00,sVar6,last_modified_00);
        goto LAB_00116cbc;
      }
    }
    else {
      iVar10 = -0x76;
    }
  }
  __s_00 = (char *)0x0;
LAB_00116cbc:
  free(pcVar12);
  free(__s);
  if (iVar10 != 0) {
    ixmlFreeDOMString(__s_00);
  }
  return iVar10;
}

Assistant:

int configure_urlbase(IXML_Document *doc,
	const struct sockaddr *serverAddr,
	const char *alias,
	time_t last_modified,
	char docURL[LINE_SIZE])
{
	char *root_path = NULL;
	char *new_alias = NULL;
	char *xml_str = NULL;
	int err_code;
	char ipaddr_port[LINE_SIZE];

	/* get IP address and port */
	err_code = addrToString(serverAddr, ipaddr_port, sizeof(ipaddr_port));
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}

	/* config url-base in 'doc' */
	err_code = config_description_doc(doc, ipaddr_port, &root_path);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc alias */
	err_code = calc_alias(alias, root_path, &new_alias);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc full url for desc doc */
	err_code = calc_descURL(ipaddr_port, new_alias, docURL);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* xml doc to str */
	xml_str = ixmlPrintDocument(doc);
	if (xml_str == NULL) {
		goto error_handler;
	}

	UpnpPrintf(
		UPNP_INFO, API, __FILE__, __LINE__, "desc url: %s\n", docURL);
	UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__, "doc = %s\n", xml_str);
	/* store in web server */
	err_code = web_server_set_alias(
		new_alias, xml_str, strlen(xml_str), last_modified);

error_handler:
	free(root_path);
	free(new_alias);

	if (err_code != UPNP_E_SUCCESS) {
		ixmlFreeDOMString(xml_str);
	}
	return err_code;
}